

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww_test.c
# Opt level: O2

bool_t wwTest(void)

{
  word *a_00;
  bool_t bVar1;
  int iVar2;
  word wVar3;
  size_t sVar4;
  uint uVar5;
  word a [8];
  word b [8];
  word c [8];
  uint uVar6;
  
  uVar5 = 0;
  uVar6 = 0;
  wwSetW(a,8,0);
  bVar1 = wwIsZero(a,8);
  if (bVar1 != 0) {
    bVar1 = wwIsZero_fast(a,8);
    if (bVar1 != 0) {
      wwSetZero(a,8);
      bVar1 = wwIsZero(a,8);
      if (bVar1 != 0) {
        bVar1 = wwIsZero_fast(a,8);
        uVar5 = uVar6;
        if (bVar1 != 0) {
          wwSetW(a,8,0x36);
          bVar1 = wwIsZero(a,8);
          if (bVar1 == 0) {
            bVar1 = wwIsZero_fast(a,8);
            if (bVar1 == 0) {
              bVar1 = wwIsW(a,8,0x36);
              if (bVar1 != 0) {
                bVar1 = wwIsW_fast(a,8,0x36);
                if (bVar1 != 0) {
                  bVar1 = wwIsW(a,8,0x5c);
                  if (bVar1 == 0) {
                    bVar1 = wwIsW_fast(a,8,0x5c);
                    if (bVar1 == 0) {
                      iVar2 = wwCmpW(a,8,0x36);
                      if (iVar2 == 0) {
                        iVar2 = wwCmpW_fast(a,8,0x36);
                        if (iVar2 == 0) {
                          iVar2 = wwCmpW(a,8,0x5c);
                          if (iVar2 < 0) {
                            iVar2 = wwCmpW_fast(a,8,0x5c);
                            if (iVar2 < 0) {
                              wwRepW(a,8,0x36);
                              bVar1 = wwIsZero(a,8);
                              if (bVar1 == 0) {
                                bVar1 = wwIsZero_fast(a,8);
                                if (bVar1 == 0) {
                                  bVar1 = wwIsRepW(a,8,0x36);
                                  if (bVar1 != 0) {
                                    bVar1 = wwIsRepW_fast(a,8,0x36);
                                    if (bVar1 != 0) {
                                      bVar1 = wwIsRepW(a,8,0x5c);
                                      if (bVar1 == 0) {
                                        bVar1 = wwIsRepW_fast(a,8,0x5c);
                                        if (bVar1 == 0) {
                                          wwCopy(a,a,8);
                                          bVar1 = wwEq(a,a,8);
                                          if (bVar1 != 0) {
                                            bVar1 = wwEq_fast(a,a,8);
                                            if (bVar1 != 0) {
                                              wwRepW(b,8,0x5c);
                                              bVar1 = wwEq(a,b,8);
                                              if (bVar1 == 0) {
                                                bVar1 = wwEq_fast(a,b,8);
                                                if (bVar1 == 0) {
                                                  iVar2 = wwCmp(a,b,8);
                                                  if (iVar2 < 0) {
                                                    iVar2 = wwCmp_fast(a,b,8);
                                                    if (iVar2 < 0) {
                                                      iVar2 = wwCmp2(a,8,b,7);
                                                      if (0 < iVar2) {
                                                        iVar2 = wwCmp2_fast(a,8,b,7);
                                                        if (0 < iVar2) {
                                                          wwSwap(a,b,8);
                                                          iVar2 = wwCmp(a,b,8);
                                                          if (0 < iVar2) {
                                                            iVar2 = wwCmp_fast(a,b,8);
                                                            if (0 < iVar2) {
                                                              iVar2 = wwCmp2(a,7,b,8);
                                                              if (iVar2 < 0) {
                                                                iVar2 = wwCmp2_fast(a,7,b,8);
                                                                if (iVar2 < 0) {
                                                                  uVar5 = 0;
                                                                  bVar1 = wwTestBit(b,0);
                                                                  if (bVar1 == 0) {
                                                                    bVar1 = wwTestBit(b,1);
                                                                    if (bVar1 != 0) {
                                                                      bVar1 = wwTestBit(b,0x40);
                                                                      if (bVar1 == 0) {
                                                                        bVar1 = wwTestBit(b,0x41);
                                                                        if (bVar1 != 0) {
                                                                          bVar1 = wwTestBit(b,0x3f);
                                                                          if (bVar1 == 0) {
                                                                            bVar1 = wwTestBit(b,0x7f
                                                  );
                                                  if (bVar1 == 0) {
                                                    wVar3 = wwGetBits(b,0x40,6);
                                                    if (wVar3 == 0x36) {
                                                      wVar3 = wwGetBits(b,0x41,5);
                                                      if (wVar3 == 0x1b) {
                                                        wwSetBit(b,0x3f,1);
                                                        bVar1 = wwTestBit(b,0x3f);
                                                        if (bVar1 != 0) {
                                                          wwFlipBit(b,0x3f);
                                                          bVar1 = wwTestBit(b,0x3f);
                                                          if (bVar1 == 0) {
                                                            uVar5 = 0;
                                                            wwSetBit(b,0x3f,0);
                                                            bVar1 = wwTestBit(b,0x3f);
                                                            if (bVar1 == 0) {
                                                              wwSetBits(b,0x3e,7,0x36);
                                                              wVar3 = wwGetBits(b,0x3e,7);
                                                              if (wVar3 == 0x36) {
                                                                wwXor(c,a,b,8);
                                                                wwXor2(c,a,8);
                                                                wwXor2(c,b,8);
                                                                bVar1 = wwIsZero(c,8);
                                                                if (bVar1 != 0) {
                                                                  wwCopy(c,b,8);
                                                                  wwXor(c,c,c,8);
                                                                  bVar1 = wwIsZero(c,8);
                                                                  if (bVar1 != 0) {
                                                                    wwCopy(c,a,8);
                                                                    wwXor2(c,c,8);
                                                                    bVar1 = wwIsZero(c,8);
                                                                    if (bVar1 != 0) {
                                                                      sVar4 = wwLoZeroBits(a,8);
                                                                      if (sVar4 == 2) {
                                                                        sVar4 = wwHiZeroBits(a,8);
                                                                        if (sVar4 == 0x39) {
                                                                          sVar4 = wwLoZeroBits(c,8);
                                                                          if (sVar4 == 0x200) {
                                                                            sVar4 = wwLoZeroBits(c,8
                                                  );
                                                  if (sVar4 == 0x200) {
                                                    wwCopy(b,a,8);
                                                    wwTrimHi(b,8,0x183);
                                                    sVar4 = wwHiZeroBits(b,8);
                                                    if (sVar4 == 0x7d) {
                                                      wwTrimLo(b,8,0x45);
                                                      sVar4 = wwLoZeroBits(b,8);
                                                      if (sVar4 == 0x46) {
                                                        wVar3 = wwShHiCarry(a,8,0x40,0x5c);
                                                        if (wVar3 == 0x5c) {
                                                          bVar1 = wwIsRepW(a,8,0x5c);
                                                          if (bVar1 != 0) {
                                                            wVar3 = wwShLoCarry(a,8,0x40,0x5c);
                                                            if (wVar3 == 0x5c) {
                                                              bVar1 = wwIsRepW(a,8,0x5c);
                                                              if (bVar1 != 0) {
                                                                wVar3 = wwShHiCarry(a,8,0x3f,0x5c);
                                                                if (wVar3 == 0x2e) {
                                                                  bVar1 = wwIsRepW(a,8,0x2e);
                                                                  if (bVar1 != 0) {
                                                                    wVar3 = wwShLoCarry(a,8,0x3f,
                                                  0x2e);
                                                  if (wVar3 == 0x5c) {
                                                    bVar1 = wwIsRepW(a,8,0x5c);
                                                    if (bVar1 != 0) {
                                                      wwShHi(a,8,0x40);
                                                      bVar1 = wwIsRepW(a + 1,7,0x5c);
                                                      if ((bVar1 != 0) && (a[0] == 0)) {
                                                        wwShLo(a,8,0x80);
                                                        bVar1 = wwIsRepW(a,6,0x5c);
                                                        if ((bVar1 != 0) &&
                                                           ((a[6] == 0 && (a[7] == 0)))) {
                                                          wwShHi(a,6,0x7f);
                                                          a_00 = a + 2;
                                                          bVar1 = wwIsRepW(a_00,4,0x2e);
                                                          if (bVar1 != 0) {
                                                            wwShLo(a_00,4,0x7f);
                                                            bVar1 = wwIsRepW(a_00,2,0x5c);
                                                            uVar5 = (uint)(bVar1 != 0);
                                                          }
                                                        }
                                                      }
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return uVar5;
}

Assistant:

bool_t wwTest()
{
	word a[8];
	word b[8];
	word c[8];
	// заполнение и сравнение
	if ((wwSetW(a, COUNT_OF(a), 0), FALSE) ||
			!SAFE(wwIsZero)(a, 8) || !FAST(wwIsZero)(a, 8) ||
		(wwSetZero(a, COUNT_OF(a)), FALSE) ||
			!SAFE(wwIsZero)(a, 8) || !FAST(wwIsZero)(a, 8) ||
		(wwSetW(a, COUNT_OF(a), 0x36), FALSE) ||
			SAFE(wwIsZero)(a, 8) || FAST(wwIsZero)(a, 8) ||
			!SAFE(wwIsW)(a, 8, 0x36) || !FAST(wwIsW)(a, 8, 0x36) ||
			SAFE(wwIsW)(a, 8, 0x5C) || FAST(wwIsW)(a, 8, 0x5C) ||
			SAFE(wwCmpW)(a, 8, 0x36) != 0 || FAST(wwCmpW)(a, 8, 0x36) != 0 ||
			SAFE(wwCmpW)(a, 8, 0x5C) >=0 || FAST(wwCmpW)(a, 8, 0x5C) >= 0 ||
		(wwRepW(a, COUNT_OF(a), 0x36), FALSE) ||
			SAFE(wwIsZero)(a, 8) || FAST(wwIsZero)(a, 8) ||
			!SAFE(wwIsRepW)(a, 8, 0x36) || !FAST(wwIsRepW)(a, 8, 0x36) ||
			SAFE(wwIsRepW)(a, 8, 0x5C) || FAST(wwIsRepW)(a, 8, 0x5C))
		return FALSE;
	// копирование и сравнение
	if ((wwCopy(a, a, 8), FALSE) ||
			!SAFE(wwEq)(a, a, 8) || !FAST(wwEq)(a, a, 8) ||
		(wwRepW(b, 8, 0x5C), FALSE) ||
			SAFE(wwEq)(a, b, 8) || FAST(wwEq)(a, b, 8) ||
			SAFE(wwCmp)(a, b, 8) >= 0 || FAST(wwCmp)(a, b, 8) >= 0 ||
			SAFE(wwCmp2)(a, 8, b, 7) <= 0 || FAST(wwCmp2)(a, 8, b, 7) <= 0 ||
		(wwSwap(a, b, 8), FALSE) ||
			SAFE(wwCmp)(a, b, 8) <= 0 || FAST(wwCmp)(a, b, 8) <= 0 ||
			SAFE(wwCmp2)(a, 7, b, 8) >= 0 || FAST(wwCmp2)(a, 7, b, 8) >= 0)
		return FALSE;
	// операции с битами
	ASSERT(wwIsRepW(b, 8, 0x36));
	if (wwTestBit(b, 0) || !wwTestBit(b, 1) ||
		wwTestBit(b, 0 + B_PER_W) || !wwTestBit(b, 1 + B_PER_W) ||
		wwTestBit(b, B_PER_W - 1) || wwTestBit(b, 2 * B_PER_W - 1) ||
		wwGetBits(b, B_PER_W, 6) != 0x36 ||
		wwGetBits(b, B_PER_W + 1, 5) != (0x36 >> 1) ||
		(wwSetBit(b, B_PER_W - 1, TRUE), FALSE) ||
			!wwTestBit(b, B_PER_W - 1) ||
		(wwFlipBit(b, B_PER_W - 1), FALSE) ||
			wwTestBit(b, B_PER_W - 1) ||
		(wwSetBit(b, B_PER_W - 1, FALSE), FALSE) ||
			wwTestBit(b, B_PER_W - 1) ||
		(wwSetBits(b, B_PER_W - 2, 7, 0x36), FALSE) ||
			wwGetBits(b, B_PER_W - 2, 7) != 0x36)
		return FALSE;
	// XOR
	if ((wwXor(c, a, b, 8), wwXor2(c, a, 8), wwXor2(c, b, 8), FALSE) ||
			!wwIsZero(c, 8) ||
		(wwCopy(c, b, 8), wwXor(c, c, c, 8), FALSE) ||
			!wwIsZero(c, 8) ||
		(wwCopy(c, a, 8), wwXor2(c, c, 8), FALSE) ||
			!wwIsZero(c, 8))
		return FALSE;
	// нулевые разряды
	ASSERT(wwIsRepW(a, 8, 0x5C) && wwIsZero(c, 8));
	if (wwLoZeroBits(a, 8) != 2 ||
		wwHiZeroBits(a, 8) != B_PER_W - 7 ||
		wwLoZeroBits(c, 8) != B_PER_W * 8 ||
		wwLoZeroBits(c, 8) != B_PER_W * 8 ||
		(wwCopy(b, a, 8), wwTrimHi(b, 8, 6 * B_PER_W + 3), FALSE) ||
			wwHiZeroBits(b, 8) != 2 * B_PER_W - 3 ||
		(wwTrimLo(b, 8, B_PER_W + 5), FALSE) ||
			wwLoZeroBits(b, 8) != B_PER_W + 6)
		return FALSE;
	// сдвиги
	ASSERT(wwIsRepW(a, 8, 0x5C));
	if (wwShHiCarry(a, 8, B_PER_W, 0x5C) != 0x5C ||
		!wwIsRepW(a, 8, 0x5C) ||
		wwShLoCarry(a, 8, B_PER_W, 0x5C) != 0x5C ||
		!wwIsRepW(a, 8, 0x5C) ||
		wwShHiCarry(a, 8, B_PER_W - 1, 0x5C) != (0x5C >> 1) ||
		!wwIsRepW(a, 8, 0x5C >> 1) ||
		wwShLoCarry(a, 8, B_PER_W - 1, 0x5C >> 1) != 0x5C ||
		!wwIsRepW(a, 8, 0x5C) ||
		(wwShHi(a, 8, B_PER_W), FALSE) ||
			!wwIsRepW(a + 1, 7, 0x5C) || a[0] != 0 ||
		(wwShLo(a, 8, 2 * B_PER_W), FALSE) ||
			!wwIsRepW(a, 6, 0x5C) || a[6] != 0 || a[7] != 0 ||
		(wwShHi(a, 6, 2 * B_PER_W - 1), FALSE) ||
			!wwIsRepW(a + 2, 4, 0x5C >> 1) ||
		(wwShLo(a + 2, 4, 2 * B_PER_W - 1), FALSE) ||
			!wwIsRepW(a + 2, 2, 0x5C))
		return FALSE;
	// все нормально
	return TRUE;
}